

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::MessageFieldGenerator::GenerateEqualsCode
          (MessageFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "if (this.$name$ == null) { \n  if (other.$name$ != null) {\n    return false;\n  }\n} else {\n  if (!this.$name$.equals(other.$name$)) {\n    return false;\n  }\n}\n"
                    );
  return;
}

Assistant:

void MessageFieldGenerator::
GenerateEqualsCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (this.$name$ == null) { \n"
    "  if (other.$name$ != null) {\n"
    "    return false;\n"
    "  }\n"
    "} else {\n"
    "  if (!this.$name$.equals(other.$name$)) {\n"
    "    return false;\n"
    "  }\n"
    "}\n");
}